

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitConstantArgsToFltArray
               (ByteCodeGenerator *byteCodeGenerator,double *vars,ParseNode *args,uint argCount)

{
  code *pcVar1;
  OpCode OVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseNodeBin *pPVar5;
  ParseNodeInt *pPVar6;
  ParseNodeFloat *pPVar7;
  ulong uVar8;
  double dVar9;
  
  OVar2 = args->nop;
  if (argCount == 0 || OVar2 != knopList) {
    uVar8 = 0;
    if (argCount == 0) goto LAB_0080f478;
  }
  else {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar8 = 0;
    do {
      pPVar5 = ParseNode::AsParseNodeBin(args);
      OVar2 = pPVar5->pnode1->nop;
      if (OVar2 == knopFlt) {
LAB_0080f434:
        pPVar5 = ParseNode::AsParseNodeBin(args);
        pPVar7 = ParseNode::AsParseNodeFloat(pPVar5->pnode1);
        dVar9 = pPVar7->dbl;
      }
      else {
        if (OVar2 != knopInt) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x1e6b,"(nop == knopFlt)","nop == knopFlt");
          if (bVar3) {
            *puVar4 = 0;
            goto LAB_0080f434;
          }
          goto LAB_0080f573;
        }
        pPVar5 = ParseNode::AsParseNodeBin(args);
        pPVar6 = ParseNode::AsParseNodeInt(pPVar5->pnode1);
        dVar9 = (double)pPVar6->lw;
      }
      vars[uVar8] = dVar9;
      uVar8 = uVar8 + 1;
      pPVar5 = ParseNode::AsParseNodeBin(args);
      args = pPVar5->pnode2;
      OVar2 = args->nop;
    } while ((OVar2 == knopList) && (uVar8 < argCount));
    if (argCount <= uVar8) {
LAB_0080f478:
      Js::Throw::InternalError();
    }
  }
  if (OVar2 == knopFlt) {
LAB_0080f4f8:
    pPVar7 = ParseNode::AsParseNodeFloat(args);
    dVar9 = pPVar7->dbl;
  }
  else {
    if (OVar2 != knopInt) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1e7d,"(args->nop == knopFlt)","args->nop == knopFlt");
      if (!bVar3) goto LAB_0080f573;
      *puVar4 = 0;
      goto LAB_0080f4f8;
    }
    pPVar6 = ParseNode::AsParseNodeInt(args);
    dVar9 = (double)pPVar6->lw;
  }
  vars[uVar8 & 0xffffffff] = dVar9;
  if ((int)uVar8 + 1U != argCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1e81,"(index == argCount)","index == argCount");
    if (!bVar3) {
LAB_0080f573:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void EmitConstantArgsToFltArray(ByteCodeGenerator *byteCodeGenerator, __out_ecount(argCount) double *vars, ParseNode *args, uint argCount)
{
    uint index = 0;
    while (args->nop == knopList && index < argCount)
    {
        OpCode nop = args->AsParseNodeBin()->pnode1->nop;
        if (nop == knopInt)
        {
            vars[index++] = (double)args->AsParseNodeBin()->pnode1->AsParseNodeInt()->lw;
        }
        else
        {
            Assert(nop == knopFlt);
            vars[index++] = args->AsParseNodeBin()->pnode1->AsParseNodeFloat()->dbl;
        }
        args = args->AsParseNodeBin()->pnode2;
    }

    if (index >= argCount)
    {
        Js::Throw::InternalError();
        return;
    }

    if (args->nop == knopInt)
    {
        vars[index++] = (double)args->AsParseNodeInt()->lw;
    }
    else
    {
        Assert(args->nop == knopFlt);
        vars[index++] = args->AsParseNodeFloat()->dbl;
    }

    Assert(index == argCount);
}